

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

size_t anon_unknown.dwarf_3217db::parent_path_end(StringRef path,Style style)

{
  char *pcVar1;
  char *pcVar2;
  Style style_00;
  undefined8 in_RCX;
  char *pcVar3;
  undefined4 in_register_00000014;
  anon_unknown_dwarf_3217db *this;
  bool bVar4;
  StringRef str;
  StringRef str_00;
  
  str.Length._4_4_ = in_register_00000014;
  str.Length._0_4_ = style;
  str.Data = (char *)path.Length;
  this = (anon_unknown_dwarf_3217db *)path.Data;
  pcVar1 = (char *)filename_pos(this,str,(Style)in_RCX);
  style_00 = (Style)in_RCX;
  if (str.Data == (char *)0x0) {
    bVar4 = false;
  }
  else {
    if (str.Data <= pcVar1) {
LAB_0017a948:
      __assert_fail("Index < Length && \"Invalid index!\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/StringRef.h"
                    ,0xef,"char llvm::StringRef::operator[](size_t) const");
    }
    bVar4 = true;
    if (this[(long)pcVar1] != (anon_unknown_dwarf_3217db)0x2f) {
      style_00 = (Style)CONCAT71((int7)((ulong)in_RCX >> 8),style == windows);
      bVar4 = this[(long)pcVar1] == (anon_unknown_dwarf_3217db)0x5c && style == windows;
    }
  }
  str_00.Length._0_4_ = style;
  str_00.Data = str.Data;
  str_00.Length._4_4_ = 0;
  pcVar2 = (char *)root_dir_start(this,str_00,style_00);
  if (pcVar1 != (char *)0x0) {
    pcVar3 = pcVar1 + -1;
    do {
      if (pcVar2 != (char *)0xffffffffffffffff && pcVar1 <= pcVar2) goto LAB_0017a92a;
      if (str.Data <= pcVar3) goto LAB_0017a948;
      if (((this + -1)[(long)pcVar1] != (anon_unknown_dwarf_3217db)0x2f) &&
         (style != windows || (this + -1)[(long)pcVar1] != (anon_unknown_dwarf_3217db)0x5c))
      goto LAB_0017a92a;
      pcVar1 = pcVar1 + -1;
    } while (pcVar1 != (char *)0x0);
    pcVar1 = (char *)0x0;
  }
LAB_0017a92a:
  pcVar3 = pcVar2 + 1;
  if (pcVar1 != pcVar2) {
    pcVar3 = pcVar1;
  }
  if (bVar4) {
    pcVar3 = pcVar1;
  }
  return (size_t)pcVar3;
}

Assistant:

size_t parent_path_end(StringRef path, Style style) {
    size_t end_pos = filename_pos(path, style);

    bool filename_was_sep =
        path.size() > 0 && is_separator(path[end_pos], style);

    // Skip separators until we reach root dir (or the start of the string).
    size_t root_dir_pos = root_dir_start(path, style);
    while (end_pos > 0 &&
           (root_dir_pos == StringRef::npos || end_pos > root_dir_pos) &&
           is_separator(path[end_pos - 1], style))
      --end_pos;

    if (end_pos == root_dir_pos && !filename_was_sep) {
      // We've reached the root dir and the input path was *not* ending in a
      // sequence of slashes. Include the root dir in the parent path.
      return root_dir_pos + 1;
    }

    // Otherwise, just include before the last slash.
    return end_pos;
  }